

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  undefined1 (*pauVar2) [12];
  uint *puVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  parasail_result_t *ppVar21;
  __m128i *palVar22;
  __m128i *ptr;
  __m128i *palVar23;
  __m128i *ptr_00;
  __m128i *palVar24;
  __m128i *ptr_01;
  __m128i *b;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  int32_t *ptr_04;
  uint uVar25;
  uint uVar26;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ushort uVar35;
  long lVar36;
  __m128i *ptr_05;
  int iVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i alVar45;
  uint uVar46;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uint uVar53;
  int iVar54;
  uint uVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  uint uVar60;
  int iVar61;
  __m128i alVar55;
  undefined4 uVar62;
  uint uVar63;
  uint uVar68;
  uint uVar69;
  uint uVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  __m128i alVar67;
  undefined4 uVar72;
  ulong uVar70;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uint uVar81;
  __m128i alVar80;
  int iVar85;
  int iVar86;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar87;
  int iVar92;
  int iVar93;
  int iVar94;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar95;
  uint uVar97;
  uint uVar98;
  uint uVar99;
  undefined1 auVar96 [16];
  int iVar100;
  int iVar101;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  undefined1 auVar102 [16];
  int iVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  __m128i alVar116;
  __m128i alVar117;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i_32_t e;
  __m128i_32_t h;
  uint local_220;
  int local_21c;
  __m128i *local_1f0;
  __m128i *local_1e8;
  __m128i *local_1e0;
  int local_1d8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  size_t len;
  longlong extraout_RDX_00;
  int32_t iVar47;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar20 = profile->s1Len;
        if ((int)uVar20 < 1) {
          parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_4();
        }
        else {
          uVar33 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_1();
          }
          else {
            iVar37 = uVar20 - 1;
            uVar70 = (ulong)uVar20 + 3;
            uVar40 = uVar70 >> 2;
            uVar39 = (uint)uVar40;
            iVar15 = iVar37 / (int)uVar39;
            uVar26 = iVar37 % (int)uVar39;
            uVar30 = -open;
            uVar16 = ppVar7->min;
            uVar18 = 0x80000000 - uVar16;
            if (uVar16 != uVar30 && SBORROW4(uVar16,uVar30) == (int)(uVar16 + open) < 0) {
              uVar18 = open | 0x80000000;
            }
            pvVar8 = (profile->profile32).matches;
            uVar16 = 0x7ffffffe - ppVar7->max;
            pvVar9 = (profile->profile32).similar;
            ppVar21 = parasail_result_new_rowcol3((uint)uVar70 & 0x7ffffffc,s2Len);
            if (ppVar21 != (parasail_result_t *)0x0) {
              ppVar21->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar21->flag | 0x4450802;
              palVar22 = parasail_memalign___m128i(0x10,uVar40);
              ptr = parasail_memalign___m128i(0x10,uVar40);
              palVar23 = parasail_memalign___m128i(0x10,uVar40);
              ptr_00 = parasail_memalign___m128i(0x10,uVar40);
              palVar24 = parasail_memalign___m128i(0x10,uVar40);
              ptr_01 = parasail_memalign___m128i(0x10,uVar40);
              b = parasail_memalign___m128i(0x10,uVar40);
              ptr_02 = parasail_memalign___m128i(0x10,uVar40);
              ptr_03 = parasail_memalign___m128i(0x10,uVar40);
              b_00 = parasail_memalign___m128i(0x10,uVar40);
              b_01 = parasail_memalign___m128i(0x10,uVar40);
              b_02 = parasail_memalign___m128i(0x10,uVar40);
              ptr_04 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              alVar116[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              alVar116[1]._0_1_ =
                   (b_01 == (__m128i *)0x0 ||
                   (b_00 == (__m128i *)0x0 || (ptr_03 == (__m128i *)0x0 || ptr_02 == (__m128i *)0x0)
                   )) || ((b == (__m128i *)0x0 ||
                          (ptr_01 == (__m128i *)0x0 || palVar24 == (__m128i *)0x0)) ||
                         ((ptr_00 == (__m128i *)0x0 || palVar23 == (__m128i *)0x0) ||
                         (ptr == (__m128i *)0x0 || palVar22 == (__m128i *)0x0)));
              uVar38 = 0;
              if ((ptr_04 != (int32_t *)0x0 && b_02 != (__m128i *)0x0) &&
                  ((b_01 != (__m128i *)0x0 &&
                   (b_00 != (__m128i *)0x0 && (ptr_03 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0)
                   )) && ((b != (__m128i *)0x0 &&
                          (ptr_01 != (__m128i *)0x0 && palVar24 != (__m128i *)0x0)) &&
                         ((ptr_00 != (__m128i *)0x0 && palVar23 != (__m128i *)0x0) &&
                         (ptr != (__m128i *)0x0 && palVar22 != (__m128i *)0x0))))) {
                iVar17 = s2Len + -1;
                uVar25 = 3 - iVar15;
                len = (size_t)uVar25;
                uVar18 = uVar18 + 1;
                alVar116[0] = uVar40;
                parasail_memset___m128i(palVar23,alVar116,len);
                alVar117[1] = extraout_RDX_00;
                alVar117[0] = uVar40;
                parasail_memset___m128i(palVar24,alVar117,len);
                c[1] = extraout_RDX_01;
                c[0] = uVar40;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_02;
                c_00[0] = uVar40;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_03;
                c_01[0] = uVar40;
                parasail_memset___m128i(b_01,c_01,len);
                c_02[1] = extraout_RDX_04;
                c_02[0] = uVar40;
                parasail_memset___m128i(b_02,c_02,len);
                uVar27 = uVar30;
                do {
                  lVar31 = 0;
                  uVar28 = uVar27;
                  do {
                    auVar48._12_4_ = 0;
                    if (s1_beg == 0) {
                      auVar48._12_4_ = uVar28;
                    }
                    *(uint *)((long)&local_48 + lVar31 * 4) = auVar48._12_4_;
                    lVar34 = (long)(int)auVar48._12_4_ - (ulong)(uint)open;
                    if (lVar34 < -0x7fffffff) {
                      lVar34 = -0x80000000;
                    }
                    *(int *)((long)&local_58 + lVar31 * 4) = (int)lVar34;
                    lVar31 = lVar31 + 1;
                    uVar28 = uVar28 - gap * uVar39;
                  } while (lVar31 != 4);
                  palVar22[uVar38][0] = local_48;
                  palVar22[uVar38][1] = lStack_40;
                  ptr_03[uVar38][0] = local_58;
                  ptr_03[uVar38][1] = lStack_50;
                  uVar38 = uVar38 + 1;
                  uVar27 = uVar27 - gap;
                } while (uVar38 != uVar40);
                *ptr_04 = 0;
                uVar38 = 1;
                uVar27 = uVar30;
                do {
                  uVar28 = 0;
                  if (s2_beg == 0) {
                    uVar28 = uVar27;
                  }
                  ptr_04[uVar38] = uVar28;
                  uVar38 = uVar38 + 1;
                  uVar27 = uVar27 - gap;
                } while (s2Len + 1 != uVar38);
                uVar27 = 1;
                if (1 < (int)uVar25) {
                  uVar27 = uVar25;
                }
                uVar28 = uVar39 - 1;
                if (s2Len < 2) {
                  uVar33 = 1;
                }
                lVar31 = (ulong)(uVar39 + (uVar39 == 0)) << 4;
                uVar38 = 0;
                auVar48._4_4_ = uVar18;
                auVar48._0_4_ = uVar18;
                auVar48._8_4_ = uVar18;
                auVar48._12_4_ = uVar18;
                auVar77 = auVar48;
                auVar83 = auVar48;
                auVar91 = auVar48;
                auVar96 = auVar48;
                uVar73 = uVar16;
                uVar74 = uVar16;
                uVar75 = uVar16;
                uVar76 = uVar16;
                local_21c = iVar17;
                do {
                  local_1e0 = ptr_00;
                  local_1e8 = ptr_01;
                  local_1f0 = ptr_02;
                  ptr_05 = ptr;
                  ptr = palVar22;
                  ptr_02 = b;
                  ptr_01 = palVar24;
                  ptr_00 = palVar23;
                  palVar23 = ptr + uVar28;
                  palVar24 = ptr_00 + uVar28;
                  iVar108 = (int)(*palVar24)[0];
                  iVar85 = *(int *)((long)*palVar24 + 4);
                  iVar86 = (int)(*palVar24)[1];
                  palVar24 = ptr_01 + uVar28;
                  iVar54 = (int)(*palVar24)[0];
                  iVar57 = *(int *)((long)*palVar24 + 4);
                  iVar59 = (int)(*palVar24)[1];
                  palVar24 = ptr_02 + uVar28;
                  iVar103 = (int)(*palVar24)[0];
                  iVar105 = *(int *)((long)*palVar24 + 4);
                  iVar107 = (int)(*palVar24)[1];
                  iVar61 = 0;
                  iVar106 = 0;
                  palVar24 = ptr + uVar28;
                  iVar19 = (int)(*palVar24)[0];
                  iVar101 = *(int *)((long)*palVar24 + 4);
                  iVar104 = (int)(*palVar24)[1];
                  iVar100 = 0;
                  iVar47 = ptr_04[uVar38];
                  lVar34 = (long)ppVar7->mapper[(byte)s2[uVar38]] * uVar40 * 0x10;
                  auVar109 = ZEXT816(0);
                  lVar36 = 0;
                  auVar113 = ZEXT816(0);
                  auVar111 = _DAT_008d0f00;
                  uVar95 = uVar18;
                  uVar97 = uVar18;
                  uVar98 = uVar18;
                  uVar99 = uVar18;
                  do {
                    piVar1 = (int *)((long)pvVar6 + lVar36 + lVar34);
                    uVar46 = iVar47 + *piVar1;
                    uVar50 = iVar19 + piVar1[1];
                    uVar51 = iVar101 + piVar1[2];
                    uVar52 = iVar104 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_03 + lVar36);
                    iVar87 = *piVar1;
                    iVar92 = piVar1[1];
                    iVar93 = piVar1[2];
                    iVar94 = piVar1[3];
                    uVar63 = (uint)((int)uVar46 < iVar87) * iVar87 |
                             ((int)uVar46 >= iVar87) * uVar46;
                    uVar68 = (uint)((int)uVar50 < iVar92) * iVar92 |
                             ((int)uVar50 >= iVar92) * uVar50;
                    uVar69 = (uint)((int)uVar51 < iVar93) * iVar93 |
                             ((int)uVar51 >= iVar93) * uVar51;
                    uVar71 = (uint)((int)uVar52 < iVar94) * iVar94 |
                             ((int)uVar52 >= iVar94) * uVar52;
                    uVar53 = ((int)uVar63 < (int)uVar95) * uVar95 |
                             ((int)uVar63 >= (int)uVar95) * uVar63;
                    uVar56 = ((int)uVar68 < (int)uVar97) * uVar97 |
                             ((int)uVar68 >= (int)uVar97) * uVar68;
                    uVar58 = ((int)uVar69 < (int)uVar98) * uVar98 |
                             ((int)uVar69 >= (int)uVar98) * uVar69;
                    uVar60 = ((int)uVar71 < (int)uVar99) * uVar99 |
                             ((int)uVar71 >= (int)uVar99) * uVar71;
                    auVar66 = *(undefined1 (*) [16])((long)*b_00 + lVar36);
                    auVar79 = *(undefined1 (*) [16])((long)*b_01 + lVar36);
                    pauVar2 = (undefined1 (*) [12])((long)*b_02 + lVar36);
                    auVar14 = *pauVar2;
                    local_158 = (int)*(undefined8 *)*pauVar2;
                    iStack_154 = (int)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
                    iStack_150 = (int)*(undefined8 *)(*pauVar2 + 8);
                    iStack_14c = (int)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
                    puVar3 = (uint *)((long)*ptr_05 + lVar36);
                    *puVar3 = uVar53;
                    puVar3[1] = uVar56;
                    puVar3[2] = uVar58;
                    puVar3[3] = uVar60;
                    auVar64._0_4_ = -(uint)((int)uVar95 < (int)uVar63);
                    auVar64._4_4_ = -(uint)((int)uVar97 < (int)uVar68);
                    auVar64._8_4_ = -(uint)((int)uVar98 < (int)uVar69);
                    auVar64._12_4_ = -(uint)((int)uVar99 < (int)uVar71);
                    auVar114 = blendvps(auVar113,auVar66,auVar64);
                    piVar1 = (int *)((long)pvVar8 + lVar36 + lVar34);
                    auVar115._0_4_ = iVar61 + *piVar1;
                    auVar115._4_4_ = iVar108 + piVar1[1];
                    auVar115._8_4_ = iVar85 + piVar1[2];
                    auVar115._12_4_ = iVar86 + piVar1[3];
                    auVar88._0_4_ = -(uint)(uVar46 == uVar53);
                    auVar88._4_4_ = -(uint)(uVar50 == uVar56);
                    auVar88._8_4_ = -(uint)(uVar51 == uVar58);
                    auVar88._12_4_ = -(uint)(uVar52 == uVar60);
                    auVar115 = blendvps(auVar114,auVar115,auVar88);
                    *(undefined1 (*) [16])((long)*local_1e0 + lVar36) = auVar115;
                    auVar114 = blendvps(auVar109,auVar79,auVar64);
                    piVar1 = (int *)((long)pvVar9 + lVar36 + lVar34);
                    auVar82._0_4_ = iVar106 + *piVar1;
                    auVar82._4_4_ = iVar54 + piVar1[1];
                    auVar82._8_4_ = iVar57 + piVar1[2];
                    auVar82._12_4_ = iVar59 + piVar1[3];
                    auVar82 = blendvps(auVar114,auVar82,auVar88);
                    *(undefined1 (*) [16])((long)*local_1e8 + lVar36) = auVar82;
                    auVar114._12_4_ = iStack_14c;
                    auVar114._0_12_ = auVar14;
                    auVar114 = blendvps(auVar111,auVar114,auVar64);
                    auVar102._0_4_ = iVar100 + 1;
                    auVar102._4_4_ = iVar103 + 1;
                    auVar102._8_4_ = iVar105 + 1;
                    auVar102._12_4_ = iVar107 + 1;
                    auVar114 = blendvps(auVar114,auVar102,auVar88);
                    *(undefined1 (*) [16])((long)*local_1f0 + lVar36) = auVar114;
                    uVar73 = ((int)uVar53 < (int)uVar73) * uVar53 |
                             ((int)uVar53 >= (int)uVar73) * uVar73;
                    uVar74 = ((int)uVar56 < (int)uVar74) * uVar56 |
                             ((int)uVar56 >= (int)uVar74) * uVar74;
                    uVar75 = ((int)uVar58 < (int)uVar75) * uVar58 |
                             ((int)uVar58 >= (int)uVar75) * uVar75;
                    uVar76 = ((int)uVar60 < (int)uVar76) * uVar60 |
                             ((int)uVar60 >= (int)uVar76) * uVar76;
                    iVar19 = auVar77._0_4_;
                    uVar46 = (iVar19 < (int)uVar53) * uVar53 |
                             (uint)(iVar19 >= (int)uVar53) * iVar19;
                    iVar19 = auVar77._4_4_;
                    uVar51 = (iVar19 < (int)uVar56) * uVar56 |
                             (uint)(iVar19 >= (int)uVar56) * iVar19;
                    iVar19 = auVar77._8_4_;
                    iVar101 = auVar77._12_4_;
                    uVar63 = (iVar19 < (int)uVar58) * uVar58 |
                             (uint)(iVar19 >= (int)uVar58) * iVar19;
                    uVar69 = (iVar101 < (int)uVar60) * uVar60 |
                             (uint)(iVar101 >= (int)uVar60) * iVar101;
                    iVar19 = auVar114._0_4_;
                    iVar101 = auVar82._0_4_;
                    uVar50 = (uint)(iVar101 < iVar19) * iVar19 | (uint)(iVar101 >= iVar19) * iVar101
                    ;
                    iVar101 = auVar114._4_4_;
                    iVar104 = auVar82._4_4_;
                    uVar52 = (uint)(iVar104 < iVar101) * iVar101 |
                             (uint)(iVar104 >= iVar101) * iVar104;
                    iVar104 = auVar114._8_4_;
                    iVar106 = auVar82._8_4_;
                    iVar54 = auVar82._12_4_;
                    uVar68 = (uint)(iVar106 < iVar104) * iVar104 |
                             (uint)(iVar106 >= iVar104) * iVar106;
                    iVar106 = auVar114._12_4_;
                    uVar71 = (uint)(iVar54 < iVar106) * iVar106 | (uint)(iVar54 >= iVar106) * iVar54
                    ;
                    iVar54 = uVar53 - open;
                    iVar57 = uVar56 - open;
                    iVar59 = uVar58 - open;
                    iVar61 = uVar60 - open;
                    iVar87 = iVar87 - gap;
                    iVar92 = iVar92 - gap;
                    iVar93 = iVar93 - gap;
                    iVar94 = iVar94 - gap;
                    auVar90._0_4_ = -(uint)(iVar87 < iVar54);
                    auVar90._4_4_ = -(uint)(iVar92 < iVar57);
                    auVar90._8_4_ = -(uint)(iVar93 < iVar59);
                    auVar90._12_4_ = -(uint)(iVar94 < iVar61);
                    auVar114 = blendvps(auVar66,auVar115,auVar90);
                    auVar88 = blendvps(auVar79,auVar82,auVar90);
                    auVar89._0_4_ = local_158 + 1;
                    auVar89._4_4_ = iStack_154 + 1;
                    auVar89._8_4_ = iStack_150 + 1;
                    auVar89._12_4_ = iStack_14c + 1;
                    auVar79._0_4_ = iVar19 + 1;
                    auVar79._4_4_ = iVar101 + 1;
                    auVar79._8_4_ = iVar104 + 1;
                    auVar79._12_4_ = iVar106 + 1;
                    auVar90 = blendvps(auVar89,auVar79,auVar90);
                    iVar101 = uVar95 - gap;
                    iVar104 = uVar97 - gap;
                    iVar106 = uVar98 - gap;
                    iVar108 = uVar99 - gap;
                    auVar66._0_4_ = -(uint)(iVar101 < iVar54);
                    auVar66._4_4_ = -(uint)(iVar104 < iVar57);
                    auVar66._8_4_ = -(uint)(iVar106 < iVar59);
                    auVar66._12_4_ = -(uint)(iVar108 < iVar61);
                    auVar113 = blendvps(auVar113,auVar115,auVar66);
                    iVar19 = auVar115._0_4_;
                    uVar95 = (uint)((int)uVar46 < iVar19) * iVar19 |
                             ((int)uVar46 >= iVar19) * uVar46;
                    iVar19 = auVar115._4_4_;
                    uVar97 = (uint)((int)uVar51 < iVar19) * iVar19 |
                             ((int)uVar51 >= iVar19) * uVar51;
                    iVar19 = auVar115._8_4_;
                    uVar98 = (uint)((int)uVar63 < iVar19) * iVar19 |
                             ((int)uVar63 >= iVar19) * uVar63;
                    iVar19 = auVar115._12_4_;
                    uVar99 = (uint)((int)uVar69 < iVar19) * iVar19 |
                             ((int)uVar69 >= iVar19) * uVar69;
                    auVar77._0_4_ =
                         ((int)uVar50 < (int)uVar95) * uVar95 |
                         ((int)uVar50 >= (int)uVar95) * uVar50;
                    auVar77._4_4_ =
                         ((int)uVar52 < (int)uVar97) * uVar97 |
                         ((int)uVar52 >= (int)uVar97) * uVar52;
                    auVar77._8_4_ =
                         ((int)uVar68 < (int)uVar98) * uVar98 |
                         ((int)uVar68 >= (int)uVar98) * uVar68;
                    auVar77._12_4_ =
                         ((int)uVar71 < (int)uVar99) * uVar99 |
                         ((int)uVar71 >= (int)uVar99) * uVar71;
                    puVar3 = (uint *)((long)*ptr_03 + lVar36);
                    *puVar3 = (uint)(iVar54 < iVar87) * iVar87 | (uint)(iVar54 >= iVar87) * iVar54;
                    puVar3[1] = (uint)(iVar57 < iVar92) * iVar92 | (uint)(iVar57 >= iVar92) * iVar57
                    ;
                    puVar3[2] = (uint)(iVar59 < iVar93) * iVar93 | (uint)(iVar59 >= iVar93) * iVar59
                    ;
                    puVar3[3] = (uint)(iVar61 < iVar94) * iVar94 | (uint)(iVar61 >= iVar94) * iVar61
                    ;
                    local_198 = auVar114._0_8_;
                    uStack_190 = auVar114._8_8_;
                    puVar4 = (undefined8 *)((long)*b_00 + lVar36);
                    *puVar4 = local_198;
                    puVar4[1] = uStack_190;
                    local_1a8 = auVar88._0_8_;
                    uStack_1a0 = auVar88._8_8_;
                    puVar4 = (undefined8 *)((long)*b_01 + lVar36);
                    *puVar4 = local_1a8;
                    puVar4[1] = uStack_1a0;
                    *(undefined1 (*) [16])((long)*b_02 + lVar36) = auVar90;
                    uVar95 = (uint)(iVar54 < iVar101) * iVar101 | (uint)(iVar54 >= iVar101) * iVar54
                    ;
                    uVar97 = (uint)(iVar57 < iVar104) * iVar104 | (uint)(iVar57 >= iVar104) * iVar57
                    ;
                    uVar98 = (uint)(iVar59 < iVar106) * iVar106 | (uint)(iVar59 >= iVar106) * iVar59
                    ;
                    uVar99 = (uint)(iVar61 < iVar108) * iVar108 | (uint)(iVar61 >= iVar108) * iVar61
                    ;
                    auVar109 = blendvps(auVar109,auVar82,auVar66);
                    auVar110._0_4_ = auVar111._0_4_ + 1;
                    auVar110._4_4_ = auVar111._4_4_ + 1;
                    auVar110._8_4_ = auVar111._8_4_ + 1;
                    auVar110._12_4_ = auVar111._12_4_ + 1;
                    auVar111 = blendvps(auVar110,auVar79,auVar66);
                    piVar1 = (int *)((long)*ptr + lVar36);
                    iVar47 = *piVar1;
                    iVar19 = piVar1[1];
                    iVar101 = piVar1[2];
                    iVar104 = piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar36);
                    iVar61 = *piVar1;
                    iVar108 = piVar1[1];
                    iVar85 = piVar1[2];
                    iVar86 = piVar1[3];
                    piVar1 = (int *)((long)*ptr_01 + lVar36);
                    iVar106 = *piVar1;
                    iVar54 = piVar1[1];
                    iVar57 = piVar1[2];
                    iVar59 = piVar1[3];
                    piVar1 = (int *)((long)*ptr_02 + lVar36);
                    iVar100 = *piVar1;
                    iVar103 = piVar1[1];
                    iVar105 = piVar1[2];
                    iVar107 = piVar1[3];
                    lVar36 = lVar36 + 0x10;
                  } while (lVar31 != lVar36);
                  uVar99 = 0;
                  do {
                    uVar46 = (uint)(*palVar23)[0];
                    uVar50 = *(uint *)((long)*palVar23 + 4);
                    uVar51 = (uint)(*palVar23)[1];
                    uVar52 = uVar30;
                    if (s2_beg == 0) {
                      uVar52 = ptr_04[uVar38 + 1] - open;
                    }
                    lVar36 = auVar113._8_8_;
                    alVar45[1] = auVar113._0_8_;
                    auVar113._0_8_ = alVar45[1] << 0x20;
                    auVar113._8_8_ = lVar36 << 0x20 | alVar45[1] >> 0x20;
                    uVar53 = ptr_04[uVar38];
                    lVar36 = auVar109._8_8_;
                    alVar45[1] = auVar109._0_8_;
                    auVar109._0_8_ = alVar45[1] << 0x20;
                    auVar109._8_8_ = lVar36 << 0x20 | alVar45[1] >> 0x20;
                    auVar112._0_4_ = auVar111._0_4_;
                    auVar112._4_4_ = auVar112._0_4_;
                    auVar112._8_4_ = auVar111._4_4_;
                    auVar112._12_4_ = auVar111._8_4_;
                    auVar111._8_8_ = auVar112._8_8_;
                    auVar111._0_8_ = (ulong)auVar112._0_4_ << 0x20 | 1;
                    lVar36 = 0;
                    uVar58 = uVar95;
                    uVar60 = uVar97;
                    uVar56 = uVar98;
                    do {
                      uVar98 = uVar60;
                      uVar97 = uVar58;
                      uVar95 = uVar52;
                      piVar1 = (int *)((long)pvVar6 + lVar36 + lVar34);
                      uVar53 = uVar53 + *piVar1;
                      uVar46 = uVar46 + piVar1[1];
                      uVar50 = uVar50 + piVar1[2];
                      uVar51 = uVar51 + piVar1[3];
                      piVar1 = (int *)((long)*ptr_05 + lVar36);
                      iVar19 = *piVar1;
                      iVar101 = piVar1[1];
                      iVar104 = piVar1[2];
                      iVar106 = piVar1[3];
                      uVar52 = (iVar19 < (int)uVar95) * uVar95 |
                               (uint)(iVar19 >= (int)uVar95) * iVar19;
                      uVar58 = (iVar101 < (int)uVar97) * uVar97 |
                               (uint)(iVar101 >= (int)uVar97) * iVar101;
                      uVar60 = (iVar104 < (int)uVar98) * uVar98 |
                               (uint)(iVar104 >= (int)uVar98) * iVar104;
                      uVar63 = (iVar106 < (int)uVar56) * uVar56 |
                               (uint)(iVar106 >= (int)uVar56) * iVar106;
                      puVar3 = (uint *)((long)*ptr_05 + lVar36);
                      *puVar3 = uVar52;
                      puVar3[1] = uVar58;
                      puVar3[2] = uVar60;
                      puVar3[3] = uVar63;
                      auVar65._0_4_ = -(uint)(uVar52 == uVar53);
                      auVar65._4_4_ = -(uint)(uVar58 == uVar46);
                      auVar65._8_4_ = -(uint)(uVar60 == uVar50);
                      auVar65._12_4_ = -(uint)(uVar63 == uVar51);
                      auVar42._0_4_ = -(uint)((int)uVar95 < iVar19);
                      auVar42._4_4_ = -(uint)((int)uVar97 < iVar101);
                      auVar42._8_4_ = -(uint)((int)uVar98 < iVar104);
                      auVar42._12_4_ = -(uint)((int)uVar56 < iVar106);
                      auVar42 = auVar42 | auVar65;
                      auVar66 = blendvps(auVar113,*(undefined1 (*) [16])((long)*local_1e0 + lVar36),
                                         auVar42);
                      *(undefined1 (*) [16])((long)*local_1e0 + lVar36) = auVar66;
                      auVar79 = blendvps(auVar109,*(undefined1 (*) [16])((long)*local_1e8 + lVar36),
                                         auVar42);
                      *(undefined1 (*) [16])((long)*local_1e8 + lVar36) = auVar79;
                      auVar114 = blendvps(auVar111,*(undefined1 (*) [16])((long)*local_1f0 + lVar36)
                                          ,auVar42);
                      *(undefined1 (*) [16])((long)*local_1f0 + lVar36) = auVar114;
                      auVar43._0_4_ = -(uint)((int)(uVar95 - gap) < (int)(uVar52 - open));
                      auVar43._4_4_ = -(uint)((int)(uVar97 - gap) < (int)(uVar58 - open));
                      auVar43._8_4_ = -(uint)((int)(uVar98 - gap) < (int)(uVar60 - open));
                      auVar43._12_4_ = -(uint)((int)(uVar56 - gap) < (int)(uVar63 - open));
                      uVar35 = ((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                                (ushort)((byte)(auVar43._12_4_ >> 7) & 1) << 0xc |
                                (ushort)((byte)(auVar43._12_4_ >> 0xf) & 1) << 0xd |
                                (ushort)((byte)(auVar43._12_4_ >> 0x17) & 1) << 0xe |
                               (ushort)(byte)(auVar43._12_4_ >> 0x1f) << 0xf) ^ 0xffff;
                      if (uVar35 == 0) {
                        iVar19 = 0x27;
                      }
                      else {
                        auVar113 = blendvps(auVar113,auVar66,auVar43);
                        auVar109 = blendvps(auVar109,auVar79,auVar43);
                        auVar90 = blendvps(auVar111,auVar114,auVar43);
                        auVar111._0_4_ = auVar90._0_4_ + 1;
                        auVar111._4_4_ = auVar90._4_4_ + 1;
                        auVar111._8_4_ = auVar90._8_4_ + 1;
                        auVar111._12_4_ = auVar90._12_4_ + 1;
                        puVar3 = (uint *)((long)*ptr + lVar36);
                        uVar53 = *puVar3;
                        uVar46 = puVar3[1];
                        uVar50 = puVar3[2];
                        uVar51 = puVar3[3];
                        iVar19 = 0;
                        uVar95 = uVar95 - gap;
                        uVar97 = uVar97 - gap;
                        uVar98 = uVar98 - gap;
                        uVar56 = uVar56 - gap;
                      }
                      uVar73 = ((int)uVar52 < (int)uVar73) * uVar52 |
                               ((int)uVar52 >= (int)uVar73) * uVar73;
                      uVar74 = ((int)uVar58 < (int)uVar74) * uVar58 |
                               ((int)uVar58 >= (int)uVar74) * uVar74;
                      uVar75 = ((int)uVar60 < (int)uVar75) * uVar60 |
                               ((int)uVar60 >= (int)uVar75) * uVar75;
                      uVar76 = ((int)uVar63 < (int)uVar76) * uVar63 |
                               ((int)uVar63 >= (int)uVar76) * uVar76;
                      iVar101 = auVar77._0_4_;
                      uVar52 = (iVar101 < (int)uVar52) * uVar52 |
                               (uint)(iVar101 >= (int)uVar52) * iVar101;
                      iVar101 = auVar77._4_4_;
                      uVar58 = (iVar101 < (int)uVar58) * uVar58 |
                               (uint)(iVar101 >= (int)uVar58) * iVar101;
                      iVar101 = auVar77._8_4_;
                      iVar104 = auVar77._12_4_;
                      uVar60 = (iVar101 < (int)uVar60) * uVar60 |
                               (uint)(iVar101 >= (int)uVar60) * iVar101;
                      uVar63 = (iVar104 < (int)uVar63) * uVar63 |
                               (uint)(iVar104 >= (int)uVar63) * iVar104;
                      iVar101 = auVar66._0_4_;
                      uVar52 = (uint)((int)uVar52 < iVar101) * iVar101 |
                               ((int)uVar52 >= iVar101) * uVar52;
                      iVar101 = auVar66._4_4_;
                      uVar58 = (uint)((int)uVar58 < iVar101) * iVar101 |
                               ((int)uVar58 >= iVar101) * uVar58;
                      iVar101 = auVar66._8_4_;
                      uVar60 = (uint)((int)uVar60 < iVar101) * iVar101 |
                               ((int)uVar60 >= iVar101) * uVar60;
                      iVar101 = auVar66._12_4_;
                      uVar63 = (uint)((int)uVar63 < iVar101) * iVar101 |
                               ((int)uVar63 >= iVar101) * uVar63;
                      iVar101 = auVar114._0_4_;
                      iVar104 = auVar79._0_4_;
                      uVar68 = (uint)(iVar104 < iVar101) * iVar101 |
                               (uint)(iVar104 >= iVar101) * iVar104;
                      iVar101 = auVar114._4_4_;
                      iVar104 = auVar79._4_4_;
                      uVar69 = (uint)(iVar104 < iVar101) * iVar101 |
                               (uint)(iVar104 >= iVar101) * iVar104;
                      iVar101 = auVar114._8_4_;
                      iVar104 = auVar79._8_4_;
                      iVar106 = auVar79._12_4_;
                      uVar71 = (uint)(iVar104 < iVar101) * iVar101 |
                               (uint)(iVar104 >= iVar101) * iVar104;
                      iVar101 = auVar114._12_4_;
                      uVar81 = (uint)(iVar106 < iVar101) * iVar101 |
                               (uint)(iVar106 >= iVar101) * iVar106;
                      auVar77._0_4_ =
                           ((int)uVar68 < (int)uVar52) * uVar52 |
                           ((int)uVar68 >= (int)uVar52) * uVar68;
                      auVar77._4_4_ =
                           ((int)uVar69 < (int)uVar58) * uVar58 |
                           ((int)uVar69 >= (int)uVar58) * uVar69;
                      auVar77._8_4_ =
                           ((int)uVar71 < (int)uVar60) * uVar60 |
                           ((int)uVar71 >= (int)uVar60) * uVar71;
                      auVar77._12_4_ =
                           ((int)uVar81 < (int)uVar63) * uVar63 |
                           ((int)uVar81 >= (int)uVar63) * uVar81;
                      if (uVar35 == 0) goto LAB_00716ae4;
                      lVar36 = lVar36 + 0x10;
                      uVar52 = uVar95;
                      uVar58 = uVar97;
                      uVar60 = uVar98;
                    } while (lVar31 != lVar36);
                    iVar19 = 0;
LAB_00716ae4:
                    uVar46 = uVar99;
                  } while ((iVar19 == 0) &&
                          (uVar46 = uVar99 + 1, bVar41 = uVar99 < 3, uVar99 = uVar46, bVar41));
                  alVar45 = ptr_05[uVar26];
                  local_98 = auVar48._0_4_;
                  iStack_94 = auVar48._4_4_;
                  iStack_90 = auVar48._8_4_;
                  iStack_8c = auVar48._12_4_;
                  iVar101 = (int)alVar45[0];
                  auVar44._0_4_ = -(uint)(local_98 < iVar101);
                  iVar104 = alVar45[0]._4_4_;
                  auVar44._4_4_ = -(uint)(iStack_94 < iVar104);
                  iVar106 = (int)alVar45[1];
                  iVar54 = alVar45[1]._4_4_;
                  auVar44._8_4_ = -(uint)(iStack_90 < iVar106);
                  auVar44._12_4_ = -(uint)(iStack_8c < iVar54);
                  auVar13._4_4_ = -(uint)(uVar25 == 2);
                  auVar13._0_4_ = -(uint)(uVar25 == 3);
                  auVar13._8_4_ = -(uint)(uVar25 == 1);
                  auVar13._12_4_ = -(uint)(uVar25 == 0);
                  iVar19 = movmskps(uVar46,auVar44 & auVar13);
                  local_1d8 = (int)uVar38;
                  if (iVar19 != 0) {
                    local_21c = local_1d8;
                  }
                  alVar80 = local_1e0[uVar26];
                  alVar116 = local_1e8[uVar26];
                  uVar62 = alVar116[1]._4_4_;
                  auVar96 = blendvps(auVar96,(undefined1  [16])alVar80,auVar44);
                  alVar117 = local_1f0[uVar26];
                  uVar72 = alVar117[1]._4_4_;
                  auVar91 = blendvps(auVar91,(undefined1  [16])alVar116,auVar44);
                  auVar83 = blendvps(auVar83,(undefined1  [16])alVar117,auVar44);
                  iVar19 = auVar83._12_4_;
                  auVar48._12_4_ = uVar27;
                  if (iVar15 < 3) {
                    do {
                      lVar34 = alVar45[1];
                      alVar45[1] = alVar45[0];
                      alVar45[0] = alVar45[1] << 0x20;
                      alVar45[1] = lVar34 << 0x20 | alVar45[1] >> 0x20;
                      lVar34 = alVar80[1];
                      alVar80[1] = alVar80[0];
                      alVar80[0] = alVar80[1] << 0x20;
                      alVar80[1] = lVar34 << 0x20 | alVar80[1] >> 0x20;
                      alVar55[0] = alVar116[0] << 0x20;
                      alVar55[1] = alVar116[1] << 0x20 | alVar116[0] >> 0x20;
                      uVar62 = (undefined4)alVar116[1];
                      alVar67[0] = alVar117[0] << 0x20;
                      alVar67[1] = alVar117[1] << 0x20 | alVar117[0] >> 0x20;
                      uVar72 = (undefined4)alVar117[1];
                      auVar48._12_4_ = auVar48._12_4_ - 1;
                      alVar116 = alVar55;
                      alVar117 = alVar67;
                    } while (auVar48._12_4_ != 0);
                  }
                  *(int *)(*((ppVar21->field_4).trace)->trace_del_table + uVar38 * 4) =
                       (int)(alVar45[1] >> 0x20);
                  *(int *)(*(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 8) +
                          uVar38 * 4) = (int)(alVar80[1] >> 0x20);
                  *(undefined4 *)
                   (*(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x10) + uVar38 * 4
                   ) = uVar62;
                  *(undefined4 *)
                   (*(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x18) + uVar38 * 4
                   ) = uVar72;
                  auVar48._0_4_ =
                       (uint)(iVar101 < local_98) * local_98 | (uint)(iVar101 >= local_98) * iVar101
                  ;
                  auVar48._4_4_ =
                       (uint)(iVar104 < iStack_94) * iStack_94 |
                       (uint)(iVar104 >= iStack_94) * iVar104;
                  auVar48._8_4_ =
                       (uint)(iVar106 < iStack_90) * iStack_90 |
                       (uint)(iVar106 >= iStack_90) * iVar106;
                  auVar48._12_4_ =
                       (uint)(iVar54 < iStack_8c) * iStack_8c | (uint)(iVar54 >= iStack_8c) * iVar54
                  ;
                  uVar38 = uVar38 + 1;
                  palVar23 = local_1e0;
                  palVar24 = local_1e8;
                  b = local_1f0;
                  palVar22 = ptr_05;
                  if (uVar38 == uVar33) {
                    lVar31 = uVar40 * 4;
                    lVar34 = uVar40 * 8;
                    lVar36 = uVar40 * 0xc;
                    lVar29 = 0;
                    do {
                      auVar111 = *(undefined1 (*) [16])((long)*ptr_05 + lVar29 * 4);
                      auVar109 = *(undefined1 (*) [16])((long)*local_1e0 + lVar29 * 4);
                      auVar113 = *(undefined1 (*) [16])((long)*local_1e8 + lVar29 * 4);
                      puVar5 = (undefined4 *)((long)*local_1f0 + lVar29 * 4);
                      uVar62 = *puVar5;
                      uVar72 = puVar5[1];
                      uVar11 = puVar5[2];
                      uVar12 = puVar5[3];
                      lVar32 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x20);
                      *(int *)(lVar32 + lVar29) = auVar111._0_4_;
                      lVar32 = lVar32 + lVar29;
                      uVar10 = extractps(auVar111,1);
                      *(undefined8 *)(lVar31 + lVar32) = uVar10;
                      uVar10 = extractps(auVar111,2);
                      *(undefined8 *)(lVar34 + lVar32) = uVar10;
                      uVar10 = extractps(auVar111,3);
                      *(undefined8 *)(lVar36 + lVar32) = uVar10;
                      lVar32 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x28);
                      *(int *)(lVar32 + lVar29) = auVar109._0_4_;
                      lVar32 = lVar32 + lVar29;
                      uVar10 = extractps(auVar109,1);
                      *(undefined8 *)(lVar31 + lVar32) = uVar10;
                      uVar10 = extractps(auVar109,2);
                      *(undefined8 *)(lVar34 + lVar32) = uVar10;
                      uVar10 = extractps(auVar109,3);
                      *(undefined8 *)(lVar36 + lVar32) = uVar10;
                      lVar32 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x30);
                      *(int *)(lVar32 + lVar29) = auVar113._0_4_;
                      lVar32 = lVar32 + lVar29;
                      uVar10 = extractps(auVar113,1);
                      *(undefined8 *)(lVar31 + lVar32) = uVar10;
                      uVar10 = extractps(auVar113,2);
                      *(undefined8 *)(lVar34 + lVar32) = uVar10;
                      uVar10 = extractps(auVar113,3);
                      *(undefined8 *)(lVar36 + lVar32) = uVar10;
                      lVar32 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x38);
                      *(undefined4 *)(lVar32 + lVar29) = uVar62;
                      lVar32 = lVar32 + lVar29;
                      *(undefined4 *)(lVar31 + lVar32) = uVar72;
                      *(undefined4 *)(lVar34 + lVar32) = uVar11;
                      *(undefined4 *)(lVar36 + lVar32) = uVar12;
                      lVar29 = lVar29 + 4;
                    } while ((ulong)(uVar39 + (uVar39 == 0)) << 2 != lVar29);
                    if (s2_end == 0) {
                      iVar101 = 0;
                      iVar104 = 0;
                      iVar19 = 0;
                      local_220 = uVar18;
                    }
                    else {
                      if (iVar15 < 3) {
                        auVar111 = auVar48;
                        uVar30 = 1;
                        if (1 < (int)uVar25) {
                          uVar30 = uVar25;
                        }
                        do {
                          auVar49._0_8_ = auVar111._0_8_ << 0x20;
                          auVar49._8_8_ = auVar111._8_8_ << 0x20 | auVar111._0_8_ >> 0x20;
                          auVar48._12_4_ = auVar111._8_4_;
                          lVar31 = auVar96._8_8_;
                          uVar33 = auVar96._0_8_;
                          auVar96._0_8_ = uVar33 << 0x20;
                          auVar96._8_8_ = lVar31 << 0x20 | uVar33 >> 0x20;
                          lVar31 = auVar91._8_8_;
                          uVar33 = auVar91._0_8_;
                          auVar91._0_8_ = uVar33 << 0x20;
                          auVar91._8_8_ = lVar31 << 0x20 | uVar33 >> 0x20;
                          auVar84._0_8_ = auVar83._0_8_ << 0x20;
                          auVar84._8_8_ = auVar83._8_8_ << 0x20 | auVar83._0_8_ >> 0x20;
                          iVar19 = auVar83._8_4_;
                          uVar30 = uVar30 - 1;
                          auVar111 = auVar49;
                          auVar83 = auVar84;
                        } while (uVar30 != 0);
                      }
                      iVar101 = (int)(auVar96._8_8_ >> 0x20);
                      iVar104 = (int)(auVar91._8_8_ >> 0x20);
                      local_220 = auVar48._12_4_;
                    }
                    iVar106 = iVar37;
                    if ((s1_end != 0) && ((uVar70 & 0x7ffffffc) != 0)) {
                      uVar33 = 0;
                      do {
                        iVar54 = ((uint)uVar33 & 3) * uVar39 + ((uint)(uVar33 >> 2) & 0x3fffffff);
                        if (iVar54 < (int)uVar20) {
                          uVar30 = *(uint *)((long)*ptr_05 + uVar33 * 4);
                          iVar57 = iVar17;
                          if (((int)local_220 < (int)uVar30) ||
                             (((uVar30 == local_220 && (local_21c == iVar17)) &&
                              (uVar30 = local_220, iVar57 = local_21c, iVar54 < iVar106)))) {
                            iVar101 = *(int *)((long)*local_1e0 + uVar33 * 4);
                            iVar104 = *(int *)((long)*local_1e8 + uVar33 * 4);
                            iVar19 = *(int *)((long)*local_1f0 + uVar33 * 4);
                            iVar106 = iVar54;
                            local_220 = uVar30;
                            local_21c = iVar57;
                          }
                        }
                        uVar33 = uVar33 + 1;
                      } while ((uVar39 & 0x1fffffff) << 2 != (int)uVar33);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      uVar33 = ptr_05[uVar26][0];
                      uVar70 = ptr_05[uVar26][1];
                      uVar40 = local_1e0[uVar26][0];
                      uVar38 = local_1e0[uVar26][1];
                      auVar91._8_8_ = local_1e8[uVar26][0];
                      auVar96._8_8_ = local_1e8[uVar26][1];
                      alVar45[1] = local_1f0[uVar26][0];
                      alVar80[1] = local_1f0[uVar26][1];
                      if (iVar15 < 3) {
                        uVar20 = 1;
                        if (1 < (int)uVar25) {
                          uVar20 = uVar25;
                        }
                        do {
                          uVar70 = uVar70 << 0x20 | uVar33 >> 0x20;
                          uVar38 = uVar38 << 0x20 | uVar40 >> 0x20;
                          auVar96._8_8_ = auVar96._8_8_ << 0x20 | auVar91._8_8_ >> 0x20;
                          alVar80[1] = alVar80[1] << 0x20 | alVar45[1] >> 0x20;
                          uVar20 = uVar20 - 1;
                          uVar33 = uVar33 << 0x20;
                          uVar40 = uVar40 << 0x20;
                          auVar91._8_8_ = auVar91._8_8_ << 0x20;
                          alVar45[1] = alVar45[1] << 0x20;
                        } while (uVar20 != 0);
                      }
                      local_220 = (uint)(uVar70 >> 0x20);
                      iVar101 = (int)(uVar38 >> 0x20);
                      iVar104 = (int)(auVar96._8_8_ >> 0x20);
                      iVar19 = (int)(alVar80[1] >> 0x20);
                      iVar106 = iVar37;
                      local_21c = iVar17;
                    }
                    auVar83._0_4_ = -(uint)((int)uVar73 < (int)uVar18);
                    auVar83._4_4_ = -(uint)((int)uVar74 < (int)uVar18);
                    auVar83._8_4_ = -(uint)((int)uVar75 < (int)uVar18);
                    auVar83._12_4_ = -(uint)((int)uVar76 < (int)uVar18);
                    auVar78._0_4_ = -(uint)((int)uVar16 < (int)auVar77._0_4_);
                    auVar78._4_4_ = -(uint)((int)uVar16 < (int)auVar77._4_4_);
                    auVar78._8_4_ = -(uint)((int)uVar16 < (int)auVar77._8_4_);
                    auVar78._12_4_ = -(uint)((int)uVar16 < (int)auVar77._12_4_);
                    iVar15 = movmskps(s1_end,auVar78 | auVar83);
                    if (iVar15 != 0) {
                      *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
                      local_220 = 0;
                      iVar101 = 0;
                      iVar104 = 0;
                      iVar19 = 0;
                      local_21c = 0;
                      iVar106 = 0;
                    }
                    ppVar21->score = local_220;
                    ppVar21->end_query = iVar106;
                    ppVar21->end_ref = local_21c;
                    ((ppVar21->field_4).stats)->matches = iVar101;
                    ((ppVar21->field_4).stats)->similar = iVar104;
                    ((ppVar21->field_4).stats)->length = iVar19;
                    parasail_free(ptr_04);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(b_00);
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(local_1f0);
                    parasail_free(ptr_01);
                    parasail_free(local_1e8);
                    parasail_free(ptr_00);
                    parasail_free(local_1e0);
                    parasail_free(ptr);
                    parasail_free(ptr_05);
                    return ppVar21;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi32(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
        result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
            vMaxHM = _mm_slli_si128(vMaxHM, 4);
            vMaxHS = _mm_slli_si128(vMaxHS, 4);
            vMaxHL = _mm_slli_si128(vMaxHL, 4);
        }
        end_query = s1Len-1;
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        matches = (int32_t) _mm_extract_epi32(vMaxHM, 3);
        similar = (int32_t) _mm_extract_epi32(vMaxHS, 3);
        length = (int32_t) _mm_extract_epi32(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t *m = (int32_t*)pvHMStore;
        int32_t *s = (int32_t*)pvHSStore;
        int32_t *l = (int32_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}